

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

fnode_service_t * fnode_service_create(char *sn,char *dev_type)

{
  fnode_service_t *pfVar1;
  size_t sVar2;
  
  pfVar1 = (fnode_service_t *)calloc(1,0x4c0);
  if (pfVar1 != (fnode_service_t *)0x0) {
    pfVar1->ref_counter = 1;
    *(undefined8 *)pfVar1->sn = *(undefined8 *)sn;
    *(undefined4 *)pfVar1->dev_type = *(undefined4 *)dev_type;
    pfVar1->socket = 0xffffffff;
    fnet_socket_init();
    sVar2 = fnet_socket_bind_all(FNET_SOCK_DGRAM,pfVar1->ifaces,0x100,1);
    pfVar1->ifaces_num = sVar2;
  }
  return pfVar1;
}

Assistant:

fnode_service_t *fnode_service_create(char const sn[FSN_LENGTH], char const dev_type[FDEV_TYPE_LENGTH])
{
    fnode_service_t *svc = malloc(sizeof(fnode_service_t));
    if (!svc)
    {
        FLOG_ERR("Unable to allocate memory for nodes interlink");
        return 0;
    }
    memset(svc, 0, sizeof *svc);

    svc->ref_counter = 1;
    memcpy(svc->sn, sn, FSN_LENGTH);
    memcpy(svc->dev_type, dev_type, FDEV_TYPE_LENGTH);
    svc->state = FSVC_INIT;
    svc->socket = FNET_INVALID_SOCKET;

    fnet_socket_init();
    fnode_service_create_iface_sockets(svc);

    return svc;
}